

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

string * __thiscall
helics::DelayFilterOperation::getString_abi_cxx11_
          (string *__return_storage_ptr__,DelayFilterOperation *this,string_view property)

{
  long lVar1;
  bool bVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  __y._M_str = "delay";
  __y._M_len = 5;
  bVar2 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y);
  if (bVar2) {
    lVar1 = (this->delay)._M_i.internalTimeCode;
    CLI::std::__cxx11::to_string
              ((string *)__return_storage_ptr__,
               (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000));
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DelayFilterOperation::getString(std::string_view property)
{
    if (property == "delay") {
        return std::to_string(delay.load());
    }
    return FilterOperations::getString(property);
}